

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::DescriptorSetLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  pointer *this;
  VkAllocationCallbacks **this_00;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)19>_> data_00;
  RefData<vk::Handle<(vk::HandleType)19>_> data_01;
  RefData<vk::Handle<(vk::HandleType)19>_> data_02;
  allocator<char> local_249;
  string local_248;
  Move<vk::Handle<(vk::HandleType)19>_> local_228;
  RefData<vk::Handle<(vk::HandleType)19>_> local_208;
  undefined1 local_1e8 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> obj3;
  RefData<vk::Handle<(vk::HandleType)19>_> local_1a8;
  undefined1 local_188 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> obj2;
  RefData<vk::Handle<(vk::HandleType)19>_> local_148;
  undefined1 local_128 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> obj1;
  Move<vk::Handle<(vk::HandleType)19>_> local_f8;
  RefData<vk::Handle<(vk::HandleType)19>_> local_d8;
  undefined1 local_b8 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> obj0;
  Resources res;
  Environment env;
  Parameters *params_local;
  Context *context_local;
  
  this = &res.immutableSamplersPtr.
          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Environment::Environment((Environment *)this,context,4);
  this_00 = &obj0.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  DescriptorSetLayout::Resources::Resources((Resources *)this_00,(Environment *)this,params);
  DescriptorSetLayout::create(&local_f8,(Environment *)this,(Resources *)this_00,params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_d8,(Move *)&local_f8);
  data.deleter.m_deviceIface = local_d8.deleter.m_deviceIface;
  data.object.m_internal = local_d8.object.m_internal;
  data.deleter.m_device = local_d8.deleter.m_device;
  data.deleter.m_allocator = local_d8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_b8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_f8);
  DescriptorSetLayout::create
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator,
             (Environment *)
             &res.immutableSamplersPtr.
              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator,params)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_148,
             (Move *)&obj2.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator
            );
  data_00.deleter.m_deviceIface = local_148.deleter.m_deviceIface;
  data_00.object.m_internal = local_148.object.m_internal;
  data_00.deleter.m_device = local_148.deleter.m_device;
  data_00.deleter.m_allocator = local_148.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_128,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator);
  DescriptorSetLayout::create
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator,
             (Environment *)
             &res.immutableSamplersPtr.
              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator,params)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1a8,
             (Move *)&obj3.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator
            );
  data_01.deleter.m_deviceIface = local_1a8.deleter.m_deviceIface;
  data_01.object.m_internal = local_1a8.object.m_internal;
  data_01.deleter.m_device = local_1a8.deleter.m_device;
  data_01.deleter.m_allocator = local_1a8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_188,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator);
  DescriptorSetLayout::create
            (&local_228,
             (Environment *)
             &res.immutableSamplersPtr.
              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator,params)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_208,(Move *)&local_228);
  data_02.deleter.m_deviceIface = local_208.deleter.m_deviceIface;
  data_02.object.m_internal = local_208.object.m_internal;
  data_02.deleter.m_device = local_208.deleter.m_device;
  data_02.deleter.m_allocator = local_208.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_1e8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_228);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_1e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_188);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_128);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"Ok",&local_249);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  DescriptorSetLayout::Resources::~Resources
            ((Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}